

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_job_pool.hpp
# Opt level: O0

mmap_disk_job * __thiscall
libtorrent::aux::disk_job_pool<libtorrent::aux::mmap_disk_job>::
allocate_job<libtorrent::aux::job::clear_piece,std::shared_ptr<libtorrent::aux::mmap_storage>,std::function<void(libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>)>,libtorrent::aux::strong_typedef<int,libtorrent::aux::piece_index_tag,void>const&>
          (disk_job_pool<libtorrent::aux::mmap_disk_job> *this,disk_job_flags_t flags,
          shared_ptr<libtorrent::aux::mmap_storage> *stor,
          function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>
          *args,strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_1)

{
  mmap_disk_job *pmVar1;
  mutex *__m;
  clear_piece local_100;
  tailqueue_node<libtorrent::aux::disk_job> local_d8;
  undefined1 local_d0 [144];
  mmap_disk_job *local_40;
  element_type *ptr;
  lock_guard<std::mutex> l;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> *args_local_1;
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>
  *args_local;
  shared_ptr<libtorrent::aux::mmap_storage> *stor_local;
  disk_job_pool<libtorrent::aux::mmap_disk_job> *this_local;
  disk_job_flags_t flags_local;
  
  __m = &this->m_job_mutex;
  l._M_device = (mutex_type *)args_1;
  ::std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&ptr,__m);
  pmVar1 = (mmap_disk_job *)
           boost::object_pool<libtorrent::aux::mmap_disk_job,_libtorrent::aux::allocator_new_delete>
           ::malloc(&this->m_job_pool,(size_t)__m);
  local_40 = pmVar1;
  tailqueue_node<libtorrent::aux::disk_job>::tailqueue_node(&local_d8);
  local_d0._0_8_ = local_d8.next;
  local_d0[8] = flags.m_val;
  libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void>::
  bitfield_flag((bitfield_flag<unsigned_char,_libtorrent::disk_storage_status_tag,_void> *)
                (local_d0 + 9));
  storage_error::storage_error((storage_error *)(local_d0 + 0x10));
  ::std::
  function<void_(libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)>::
  function(&local_100.handler,args);
  local_100.piece.m_val = ((l._M_device)->super___mutex_base)._M_mutex.__data.__lock;
  ::std::
  variant<libtorrent::aux::job::read,libtorrent::aux::job::write,libtorrent::aux::job::hash,libtorrent::aux::job::hash2,libtorrent::aux::job::move_storage,libtorrent::aux::job::release_files,libtorrent::aux::job::delete_files,libtorrent::aux::job::check_fastresume,libtorrent::aux::job::rename_file,libtorrent::aux::job::stop_torrent,libtorrent::aux::job::file_priority,libtorrent::aux::job::clear_piece,libtorrent::aux::job::partial_read>
  ::variant<libtorrent::aux::job::clear_piece,void,void,libtorrent::aux::job::clear_piece,void>
            ((variant<libtorrent::aux::job::read,libtorrent::aux::job::write,libtorrent::aux::job::hash,libtorrent::aux::job::hash2,libtorrent::aux::job::move_storage,libtorrent::aux::job::release_files,libtorrent::aux::job::delete_files,libtorrent::aux::job::check_fastresume,libtorrent::aux::job::rename_file,libtorrent::aux::job::stop_torrent,libtorrent::aux::job::file_priority,libtorrent::aux::job::clear_piece,libtorrent::aux::job::partial_read>
              *)(local_d0 + 0x28),&local_100);
  disk_job::disk_job((disk_job *)pmVar1,(disk_job *)local_d0);
  ::std::shared_ptr<libtorrent::aux::mmap_storage>::shared_ptr(&pmVar1->storage,stor);
  disk_job::~disk_job((disk_job *)local_d0);
  job::clear_piece::~clear_piece(&local_100);
  boost::object_pool<libtorrent::aux::mmap_disk_job,_libtorrent::aux::allocator_new_delete>::
  set_next_size(&this->m_job_pool,100);
  pmVar1 = local_40;
  this->m_jobs_in_use = this->m_jobs_in_use + 1;
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&ptr);
  return pmVar1;
}

Assistant:

T* allocate_job(
			disk_job_flags_t const flags
			, Storage stor
			, Args&&... args)
		{
			std::lock_guard<std::mutex> l(m_job_mutex);
			auto* ptr = m_job_pool.malloc();
			new (ptr) T{
				disk_job{
				tailqueue_node<disk_job>{},
				flags,
				status_t{},
				storage_error{},
				JobType{std::forward<Args>(args)...},
#if TORRENT_USE_ASSERTS
				true, // in_use
				false, // job_posted
				false, // callback_called
				false, // blocked
#endif
				},
				std::move(stor)};
			m_job_pool.set_next_size(100);
			++m_jobs_in_use;
			if constexpr (std::is_same_v<JobType, job::read>)
				++m_read_jobs;
			else if constexpr (std::is_same_v<JobType, job::write>)
				++m_write_jobs;

			return ptr;
		}